

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar1 = comp->nbState;
  if (0 < (long)iVar1) {
    piVar3 = comp->states;
    uVar6 = 0;
    do {
      if (piVar3[uVar6 * 2] < 0) {
        piVar3[uVar6 * 2] = idx;
        piVar3[uVar6 * 2 + 1] = level;
        goto LAB_001751a8;
      }
      uVar6 = uVar6 + 1;
    } while ((long)iVar1 != uVar6);
  }
  iVar2 = comp->maxState;
  if (iVar2 <= iVar1) {
    if (iVar2 < 1) {
      uVar5 = 4;
    }
    else {
      uVar5 = 0xffffffff;
      if (iVar2 < 1000000000) {
        uVar4 = iVar2 + 1U >> 1;
        uVar5 = uVar4 + iVar2;
        if ((int)(1000000000 - uVar4) < iVar2) {
          uVar5 = 1000000000;
        }
      }
    }
    uVar6 = 0xffffffff;
    if (((int)uVar5 < 0) ||
       (piVar3 = (int *)(*xmlRealloc)(comp->states,(ulong)uVar5 << 3), piVar3 == (int *)0x0))
    goto LAB_001751a8;
    comp->states = piVar3;
    comp->maxState = uVar5;
  }
  piVar3 = comp->states;
  piVar3[(long)comp->nbState * 2] = idx;
  iVar1 = comp->nbState;
  comp->nbState = iVar1 + 1;
  piVar3[(long)iVar1 * 2 + 1] = level;
  uVar6 = (ulong)(comp->nbState - 1);
LAB_001751a8:
  return (int)uVar6;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxState, sizeof(tmp[0]) * 2,
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: growCapacity failed\n");
	    return(-1);
        }
	tmp = xmlRealloc(comp->states, newSize * sizeof(tmp[0]) * 2);
	if (tmp == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = tmp;
        comp->maxState = newSize;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}